

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::AnalyzeScriptTree(DescriptorNode *this)

{
  string *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  CfdException *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>,_bool>
  pVar4;
  allocator local_699;
  string local_698;
  CfdSourceLocation local_678;
  CfdSourceLocation local_660;
  _Base_ptr local_648;
  undefined1 local_640;
  allocator local_631;
  string local_630;
  undefined1 local_610 [8];
  DescriptorNode node_2;
  allocator local_479;
  string local_478;
  undefined1 local_458 [8];
  DescriptorNode node_1;
  CfdSourceLocation local_2d0;
  CfdSourceLocation local_2b8;
  string local_2a0 [32];
  CfdSourceLocation local_280;
  _Base_ptr local_268;
  undefined1 local_260;
  allocator local_251;
  string local_250;
  undefined1 local_230 [8];
  DescriptorNode node;
  char *str;
  size_t idx;
  string temp_name;
  undefined1 local_60 [4];
  uint32_t tapleaf_count;
  string tapscript;
  size_t offset;
  string local_30 [4];
  uint32_t script_depth;
  string desc;
  DescriptorNode *this_local;
  
  desc.field_2._8_8_ = this;
  ::std::__cxx11::string::string(local_30,(string *)&this->value_);
  offset._4_4_ = 0;
  tapscript.field_2._8_8_ = 0;
  ::std::__cxx11::string::string((string *)local_60);
  temp_name.field_2._12_4_ = 0;
  ::std::__cxx11::string::string((string *)&idx);
  for (str = (char *)0x0; pcVar2 = (char *)::std::__cxx11::string::size(), str < pcVar2;
      str = str + 1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_30);
    if ((*pcVar2 == ' ') || (*pcVar2 == '{')) {
      if (offset._4_4_ == 0) {
        tapscript.field_2._8_8_ = tapscript.field_2._8_8_ + 1;
      }
    }
    else if ((*pcVar2 == ',') || (*pcVar2 == '}')) {
      if (offset._4_4_ == 0) {
        ::std::__cxx11::string::substr
                  ((ulong)((long)&node.parent_kind_.field_2 + 8),(ulong)local_30);
        ::std::__cxx11::string::operator=
                  ((string *)local_60,(string *)(node.parent_kind_.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(node.parent_kind_.field_2._M_local_buf + 8));
        uVar3 = ::std::__cxx11::string::length();
        if (uVar3 < 0x40) {
          tapscript.field_2._8_8_ = tapscript.field_2._8_8_ + 1;
        }
        else {
          tapscript.field_2._8_8_ = str + 1;
          DescriptorNode((DescriptorNode *)local_230,&this->addr_prefixes_);
          ::std::__cxx11::string::operator=((string *)local_230,(string *)&idx);
          node.depth_ = 2;
          ::std::__cxx11::string::operator=
                    ((string *)(node.name_.field_2._M_local_buf + 8),(string *)local_60);
          node.checksum_.field_2._8_4_ = 1;
          ::std::__cxx11::string::operator=
                    ((string *)
                     &node.addr_prefixes_.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"tr");
          uVar3 = ::std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            AnalyzeChild((DescriptorNode *)local_230,(string *)local_60,2);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_250,"tr",&local_251);
          AnalyzeAll((DescriptorNode *)local_230,&local_250);
          ::std::__cxx11::string::~string((string *)&local_250);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
          pVar4 = ::std::
                  map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                  ::emplace<std::__cxx11::string&,cfd::core::DescriptorNode&>
                            ((map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                              *)&this->tree_node_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_60,(DescriptorNode *)local_230);
          local_268 = (_Base_ptr)pVar4.first._M_node;
          local_260 = pVar4.second;
          ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
          emplace_back<cfd::core::DescriptorNode&>
                    ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
                     &this->child_node_,(DescriptorNode *)local_230);
          temp_name.field_2._12_4_ = temp_name.field_2._12_4_ + 1;
          ::std::__cxx11::string::operator=((string *)local_60,"");
          ::std::__cxx11::string::operator=((string *)&idx,"");
          local_280.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_280.filename = local_280.filename + 1;
          local_280.line = 0x5fd;
          local_280.funcname = "AnalyzeScriptTree";
          logger::info<unsigned_int&,std::__cxx11::string&>
                    (&local_280,"HashTarget script_depth={}, child.value={}",
                     (uint *)((long)&offset + 4),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&node.name_.field_2 + 8));
          ~DescriptorNode((DescriptorNode *)local_230);
        }
      }
    }
    else if (*pcVar2 == '(') {
      if (offset._4_4_ == 0) {
        ::std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_30);
        ::std::__cxx11::string::operator=((string *)&idx,local_2a0);
        ::std::__cxx11::string::~string(local_2a0);
      }
      local_2b8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_2b8.filename = local_2b8.filename + 1;
      local_2b8.line = 0x609;
      local_2b8.funcname = "AnalyzeScriptTree";
      logger::info<unsigned_int&,std::__cxx11::string&>
                (&local_2b8,"Target`(` script_depth={}, name={}",(uint *)((long)&offset + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx);
      offset._4_4_ = offset._4_4_ + 1;
    }
    else if (*pcVar2 == ')') {
      offset._4_4_ = offset._4_4_ + -1;
      local_2d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_2d0.filename = local_2d0.filename + 1;
      local_2d0.line = 0x60e;
      local_2d0.funcname = "AnalyzeScriptTree";
      logger::info<unsigned_int&>
                (&local_2d0,"Target`)` script_depth = {}",(uint *)((long)&offset + 4));
      if (offset._4_4_ == 0) {
        ::std::__cxx11::string::substr
                  ((ulong)((long)&node_1.parent_kind_.field_2 + 8),(ulong)local_30);
        this_00 = (string *)(node_1.parent_kind_.field_2._M_local_buf + 8);
        ::std::__cxx11::string::operator=((string *)local_60,this_00);
        ::std::__cxx11::string::~string(this_00);
        tapscript.field_2._8_8_ = str + 1;
        DescriptorNode((DescriptorNode *)local_458,&this->addr_prefixes_);
        ::std::__cxx11::string::operator=((string *)local_458,(string *)&idx);
        node_1.depth_ = 1;
        ::std::__cxx11::string::operator=
                  ((string *)(node_1.name_.field_2._M_local_buf + 8),(string *)local_60);
        node_1.checksum_.field_2._8_4_ = 1;
        ::std::__cxx11::string::operator=
                  ((string *)
                   &node_1.addr_prefixes_.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"tr");
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          AnalyzeChild((DescriptorNode *)local_458,(string *)local_60,2);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_478,"tr",&local_479);
        AnalyzeAll((DescriptorNode *)local_458,&local_478);
        ::std::__cxx11::string::~string((string *)&local_478);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
        ::std::
        map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
        ::emplace<std::__cxx11::string&,cfd::core::DescriptorNode&>
                  ((map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                    *)&this->tree_node_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (DescriptorNode *)local_458);
        ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
        emplace_back<cfd::core::DescriptorNode&>
                  ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
                   &this->child_node_,(DescriptorNode *)local_458);
        temp_name.field_2._12_4_ = temp_name.field_2._12_4_ + 1;
        ::std::__cxx11::string::operator=((string *)local_60,"");
        ::std::__cxx11::string::operator=((string *)&idx,"");
        pcVar2 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
        node_2.parent_kind_.field_2._8_8_ = pcVar2 + 1;
        logger::info<unsigned_int&,std::__cxx11::string&>
                  ((CfdSourceLocation *)((long)&node_2.parent_kind_.field_2 + 8),
                   "Target`)` script_depth={}, child.value={}",(uint *)((long)&offset + 4),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_1.name_.field_2 + 8));
        ~DescriptorNode((DescriptorNode *)local_458);
      }
    }
  }
  bVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
          ::empty(&this->tree_node_);
  if (bVar1) {
    uVar3 = ::std::__cxx11::string::length();
    if (uVar3 < 0x40) {
      local_678.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_678.filename = local_678.filename + 1;
      local_678.line = 0x63d;
      local_678.funcname = "AnalyzeScriptTree";
      logger::warn<>(&local_678,"Failed to taproot. empty script.");
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_698,"Failed to taproot. empty script.",&local_699);
      CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_698);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::operator=((string *)local_60,(string *)&this->value_);
    DescriptorNode((DescriptorNode *)local_610,&this->addr_prefixes_);
    ::std::__cxx11::string::operator=((string *)local_610,(string *)&idx);
    node_2.depth_ = 2;
    ::std::__cxx11::string::operator=
              ((string *)(node_2.name_.field_2._M_local_buf + 8),(string *)local_60);
    node_2.checksum_.field_2._8_4_ = 1;
    ::std::__cxx11::string::operator=
              ((string *)
               &node_2.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"tr");
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      AnalyzeChild((DescriptorNode *)local_610,(string *)local_60,2);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_630,"tr",&local_631);
    AnalyzeAll((DescriptorNode *)local_610,&local_630);
    ::std::__cxx11::string::~string((string *)&local_630);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_631);
    pVar4 = ::std::
            map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
            ::emplace<std::__cxx11::string&,cfd::core::DescriptorNode&>
                      ((map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                        *)&this->tree_node_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(DescriptorNode *)local_610);
    local_648 = (_Base_ptr)pVar4.first._M_node;
    local_640 = pVar4.second;
    ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
    emplace_back<cfd::core::DescriptorNode&>
              ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
               &this->child_node_,(DescriptorNode *)local_610);
    temp_name.field_2._12_4_ = temp_name.field_2._12_4_ + 1;
    ::std::__cxx11::string::operator=((string *)local_60,"");
    ::std::__cxx11::string::operator=((string *)&idx,"");
    local_660.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_660.filename = local_660.filename + 1;
    local_660.line = 0x63a;
    local_660.funcname = "AnalyzeScriptTree";
    logger::info<unsigned_int&,std::__cxx11::string&>
              (&local_660,"LastTarget script_depth={}, child.value={}",(uint *)((long)&offset + 4),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&node_2.name_.field_2 + 8));
    ~DescriptorNode((DescriptorNode *)local_610);
  }
  ::std::__cxx11::string::~string((string *)&idx);
  ::std::__cxx11::string::~string((string *)local_60);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void DescriptorNode::AnalyzeScriptTree() {
  auto desc = value_;

  uint32_t script_depth = 0;
  size_t offset = 0;
  std::string tapscript;
  uint32_t tapleaf_count = 0;
  std::string temp_name;
  for (size_t idx = 0; idx < desc.size(); ++idx) {
    const char& str = desc[idx];
    if ((str == ' ') || (str == '{')) {
      if (script_depth == 0) ++offset;
    } else if ((str == ',') || (str == '}')) {
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset);
        if (tapscript.length() >= (kByteData256Length * 2)) {
          offset = idx + 1;
          DescriptorNode node(addr_prefixes_);
          node.name_ = temp_name;
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.value_ = tapscript;
          node.depth_ = 1;
          node.parent_kind_ = "tr";
          if (!temp_name.empty()) {
            node.AnalyzeChild(tapscript, 2);
          }
          node.AnalyzeAll("tr");
          tree_node_.emplace(tapscript, node);
          child_node_.emplace_back(node);
          ++tapleaf_count;
          tapscript = "";
          temp_name = "";
          info(
              CFD_LOG_SOURCE, "HashTarget script_depth={}, child.value={}",
              script_depth, node.value_);
        } else {
          ++offset;
        }
      }
    } else if (str == '(') {
      if (script_depth == 0) {
        temp_name = desc.substr(offset, idx - offset);
        // offset = idx + 1;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` script_depth={}, name={}", script_depth,
          temp_name);
      ++script_depth;
    } else if (str == ')') {
      --script_depth;
      info(CFD_LOG_SOURCE, "Target`)` script_depth = {}", script_depth);
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset + 1);
        offset = idx + 1;
        DescriptorNode node(addr_prefixes_);
        node.name_ = temp_name;
        node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
        node.value_ = tapscript;
        node.depth_ = 1;
        node.parent_kind_ = "tr";
        if (!temp_name.empty()) {
          node.AnalyzeChild(tapscript, 2);
        }
        node.AnalyzeAll("tr");
        tree_node_.emplace(tapscript, node);
        child_node_.emplace_back(node);
        ++tapleaf_count;
        tapscript = "";
        temp_name = "";
        info(
            CFD_LOG_SOURCE, "Target`)` script_depth={}, child.value={}",
            script_depth, node.value_);
      }
    }
  }
  if (tree_node_.empty()) {
    if (value_.length() >= (kByteData256Length * 2)) {
      tapscript = value_;
      DescriptorNode node(addr_prefixes_);
      node.name_ = temp_name;
      node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
      node.value_ = tapscript;
      node.depth_ = 1;
      node.parent_kind_ = "tr";
      if (!temp_name.empty()) {
        node.AnalyzeChild(tapscript, 2);
      }
      node.AnalyzeAll("tr");
      tree_node_.emplace(tapscript, node);
      child_node_.emplace_back(node);
      ++tapleaf_count;
      tapscript = "";
      temp_name = "";
      info(
          CFD_LOG_SOURCE, "LastTarget script_depth={}, child.value={}",
          script_depth, node.value_);
    } else {
      warn(CFD_LOG_SOURCE, "Failed to taproot. empty script.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. empty script.");
    }
  }
}